

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

void __thiscall
wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
HeapType>>>const&)::CodeUpdater::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  Type TVar1;
  AtomicWait *pAVar2;
  CallIndirect *pCVar3;
  Store *pSVar4;
  MemoryGrow *pMVar5;
  
  if (curr->_id == LocalSetId) {
    if ((curr->type).id < 2) {
      return;
    }
LAB_00af475e:
    TVar1 = Function::getLocalType(*(Function **)((long)this + 0xf8),curr[1]._id);
    (curr->type).id = TVar1.id;
    return;
  }
  if (curr->_id == LocalGetId) goto LAB_00af475e;
  TVar1 = getNew(wasm::Type_(this,(curr->type).id);
  (curr->type).id = TVar1.id;
  switch(curr->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Expression::cast<wasm::Block>(curr);
    return;
  case IfId:
    Expression::cast<wasm::If>(curr);
    return;
  case LoopId:
    Expression::cast<wasm::Loop>(curr);
    return;
  case BreakId:
    Expression::cast<wasm::Break>(curr);
    return;
  case SwitchId:
    Expression::cast<wasm::Switch>(curr);
    return;
  case CallId:
    Expression::cast<wasm::Call>(curr);
    return;
  case CallIndirectId:
    pCVar3 = Expression::cast<wasm::CallIndirect>(curr);
    TVar1.id = (uintptr_t)getNew(wasm::HeapType_(this,(pCVar3->heapType).id);
    break;
  case LocalGetId:
    Expression::cast<wasm::LocalGet>(curr);
    return;
  case LocalSetId:
    Expression::cast<wasm::LocalSet>(curr);
    return;
  case GlobalGetId:
    Expression::cast<wasm::GlobalGet>(curr);
    return;
  case GlobalSetId:
    Expression::cast<wasm::GlobalSet>(curr);
    return;
  case LoadId:
    Expression::cast<wasm::Load>(curr);
    return;
  case StoreId:
    pSVar4 = Expression::cast<wasm::Store>(curr);
    TVar1 = getNew(wasm::Type_(this,(pSVar4->valueType).id);
    (pSVar4->valueType).id = TVar1.id;
    return;
  case ConstId:
    Expression::cast<wasm::Const>(curr);
    return;
  case UnaryId:
    Expression::cast<wasm::Unary>(curr);
    return;
  case BinaryId:
    Expression::cast<wasm::Binary>(curr);
    return;
  case SelectId:
    Expression::cast<wasm::Select>(curr);
    return;
  case DropId:
    Expression::cast<wasm::Drop>(curr);
    return;
  case ReturnId:
    Expression::cast<wasm::Return>(curr);
    return;
  case MemorySizeId:
    pCVar3 = (CallIndirect *)Expression::cast<wasm::MemorySize>(curr);
    TVar1 = getNew(wasm::Type_(this,((Type *)&pCVar3->heapType)->id);
    break;
  case MemoryGrowId:
    pMVar5 = Expression::cast<wasm::MemoryGrow>(curr);
    goto LAB_00af4b89;
  case NopId:
    Expression::cast<wasm::Nop>(curr);
    return;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(curr);
    return;
  case AtomicRMWId:
    Expression::cast<wasm::AtomicRMW>(curr);
    return;
  case AtomicCmpxchgId:
    Expression::cast<wasm::AtomicCmpxchg>(curr);
    return;
  case AtomicWaitId:
    pAVar2 = Expression::cast<wasm::AtomicWait>(curr);
    goto LAB_00af48b8;
  case AtomicNotifyId:
    Expression::cast<wasm::AtomicNotify>(curr);
    return;
  case AtomicFenceId:
    Expression::cast<wasm::AtomicFence>(curr);
    return;
  case SIMDExtractId:
    Expression::cast<wasm::SIMDExtract>(curr);
    return;
  case SIMDReplaceId:
    Expression::cast<wasm::SIMDReplace>(curr);
    return;
  case SIMDShuffleId:
    Expression::cast<wasm::SIMDShuffle>(curr);
    return;
  case SIMDTernaryId:
    Expression::cast<wasm::SIMDTernary>(curr);
    return;
  case SIMDShiftId:
    Expression::cast<wasm::SIMDShift>(curr);
    return;
  case SIMDLoadId:
    Expression::cast<wasm::SIMDLoad>(curr);
    return;
  case SIMDLoadStoreLaneId:
    Expression::cast<wasm::SIMDLoadStoreLane>(curr);
    return;
  case MemoryInitId:
    Expression::cast<wasm::MemoryInit>(curr);
    return;
  case DataDropId:
    Expression::cast<wasm::DataDrop>(curr);
    return;
  case MemoryCopyId:
    Expression::cast<wasm::MemoryCopy>(curr);
    return;
  case MemoryFillId:
    Expression::cast<wasm::MemoryFill>(curr);
    return;
  case PopId:
    Expression::cast<wasm::Pop>(curr);
    return;
  case RefNullId:
    Expression::cast<wasm::RefNull>(curr);
    return;
  case RefIsNullId:
    Expression::cast<wasm::RefIsNull>(curr);
    return;
  case RefFuncId:
    Expression::cast<wasm::RefFunc>(curr);
    return;
  case RefEqId:
    Expression::cast<wasm::RefEq>(curr);
    return;
  case TableGetId:
    Expression::cast<wasm::TableGet>(curr);
    return;
  case TableSetId:
    Expression::cast<wasm::TableSet>(curr);
    return;
  case TableSizeId:
    Expression::cast<wasm::TableSize>(curr);
    return;
  case TableGrowId:
    Expression::cast<wasm::TableGrow>(curr);
    return;
  case TryId:
    Expression::cast<wasm::Try>(curr);
    return;
  case ThrowId:
    Expression::cast<wasm::Throw>(curr);
    return;
  case RethrowId:
    Expression::cast<wasm::Rethrow>(curr);
    return;
  case TupleMakeId:
    Expression::cast<wasm::TupleMake>(curr);
    return;
  case TupleExtractId:
    Expression::cast<wasm::TupleExtract>(curr);
    return;
  case I31NewId:
    Expression::cast<wasm::I31New>(curr);
    return;
  case I31GetId:
    Expression::cast<wasm::I31Get>(curr);
    return;
  case CallRefId:
    Expression::cast<wasm::CallRef>(curr);
    return;
  case RefTestId:
    pMVar5 = (MemoryGrow *)Expression::cast<wasm::RefTest>(curr);
LAB_00af4b89:
    TVar1 = getNew(wasm::Type_(this,(pMVar5->ptrType).id);
    (pMVar5->ptrType).id = TVar1.id;
    return;
  case RefCastId:
    Expression::cast<wasm::RefCast>(curr);
    return;
  case BrOnId:
    pAVar2 = (AtomicWait *)Expression::cast<wasm::BrOn>(curr);
LAB_00af48b8:
    TVar1 = getNew(wasm::Type_(this,(pAVar2->expectedType).id);
    (pAVar2->expectedType).id = TVar1.id;
    return;
  case StructNewId:
    Expression::cast<wasm::StructNew>(curr);
    return;
  case StructGetId:
    Expression::cast<wasm::StructGet>(curr);
    return;
  case StructSetId:
    Expression::cast<wasm::StructSet>(curr);
    return;
  case ArrayNewId:
    Expression::cast<wasm::ArrayNew>(curr);
    return;
  case ArrayNewSegId:
    Expression::cast<wasm::ArrayNewSeg>(curr);
    return;
  case ArrayNewFixedId:
    Expression::cast<wasm::ArrayNewFixed>(curr);
    return;
  case ArrayGetId:
    Expression::cast<wasm::ArrayGet>(curr);
    return;
  case ArraySetId:
    Expression::cast<wasm::ArraySet>(curr);
    return;
  case ArrayLenId:
    Expression::cast<wasm::ArrayLen>(curr);
    return;
  case ArrayCopyId:
    Expression::cast<wasm::ArrayCopy>(curr);
    return;
  case ArrayFillId:
    Expression::cast<wasm::ArrayFill>(curr);
    return;
  case ArrayInitId:
    Expression::cast<wasm::ArrayInit>(curr);
    return;
  case RefAsId:
    Expression::cast<wasm::RefAs>(curr);
    return;
  case StringNewId:
    Expression::cast<wasm::StringNew>(curr);
    return;
  case StringConstId:
    Expression::cast<wasm::StringConst>(curr);
    return;
  case StringMeasureId:
    Expression::cast<wasm::StringMeasure>(curr);
    return;
  case StringEncodeId:
    Expression::cast<wasm::StringEncode>(curr);
    return;
  case StringConcatId:
    Expression::cast<wasm::StringConcat>(curr);
    return;
  case StringEqId:
    Expression::cast<wasm::StringEq>(curr);
    return;
  case StringAsId:
    Expression::cast<wasm::StringAs>(curr);
    return;
  case StringWTF8AdvanceId:
    Expression::cast<wasm::StringWTF8Advance>(curr);
    return;
  case StringWTF16GetId:
    Expression::cast<wasm::StringWTF16Get>(curr);
    return;
  case StringIterNextId:
    Expression::cast<wasm::StringIterNext>(curr);
    return;
  case StringIterMoveId:
    Expression::cast<wasm::StringIterMove>(curr);
    return;
  case StringSliceWTFId:
    Expression::cast<wasm::StringSliceWTF>(curr);
    return;
  case StringSliceIterId:
    Expression::cast<wasm::StringSliceIter>(curr);
    return;
  default:
    goto switchD_00af4749_default;
  }
  ((Type *)&pCVar3->heapType)->id = TVar1.id;
switchD_00af4749_default:
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      // local.get and local.tee are special in that their type is tied to the
      // type of the local in the function, which is tied to the signature. That
      // means we must update it based on the signature, and not on the old type
      // in the local.
      //
      // We have already updated function signatures by the time we get here,
      // which means we can just apply the current local type that we see (there
      // is no need to call getNew(), which we already did on the function's
      // signature itself).
      if (auto* get = curr->dynCast<LocalGet>()) {
        curr->type = getFunction()->getLocalType(get->index);
        return;
      } else if (auto* tee = curr->dynCast<LocalSet>()) {
        // Rule out a local.set and unreachable code.
        if (tee->type != Type::none && tee->type != Type::unreachable) {
          curr->type = getFunction()->getLocalType(tee->index);
        }
        return;
      }

      // Update the type to the new one.
      curr->type = getNew(curr->type);

      // Update any other type fields as well.

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_HEAPTYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
    }